

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall MxxSort_Unique_Test::TestBody(MxxSort_Unique_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_char[7]> __os;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_int> __os_00;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_char[10]> __os_01;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_unsigned_long> __os_02;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_char[19]> __os_03;
  __rvalue_stream_insertion_t<mxx::sync_basic_ostream<char>,_std::vector<int>_> this_00;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  reference actual;
  AssertHelper local_2f0;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_1;
  size_t i_1;
  AssertHelper local_2b8;
  Message local_2b0;
  size_type local_2a8;
  unsigned_long local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  undefined1 local_268 [8];
  vector<int,_std::allocator<int>_> all;
  int local_244;
  sync_ostream local_240;
  allocator<int> local_109;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  undefined1 local_f8 [8];
  vector<int,_std::allocator<int>_> unique_els;
  iterator newend;
  undefined4 local_60 [2];
  int i;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> vec;
  comm c;
  MxxSort_Unique_Test *this_local;
  
  mxx::comm::comm((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,100,&local_49);
  std::allocator<int>::~allocator(&local_49);
  iVar3 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  srand(iVar3 * 0xd);
  local_60[0] = 0;
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  iVar5 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_48)
  ;
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,MxxSort_Unique_Test::TestBody()::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (anon_class_8_1_54a39809)local_60);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  iVar5 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_48)
  ;
  mxx::comm::comm((comm *)&newend);
  mxx::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (comm *)&newend);
  mxx::comm::~comm((comm *)&newend);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  iVar5 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_48)
  ;
  mxx::comm::comm((comm *)&unique_els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  _Var6 = mxx::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (iVar4._M_current,iVar5._M_current,
                     (comm *)&unique_els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  mxx::comm::~comm((comm *)&unique_els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  local_100._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  local_108 = _Var6;
  std::allocator<int>::allocator(&local_109);
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)local_f8,local_100,local_108,&local_109);
  std::allocator<int>::~allocator(&local_109);
  mxx::sync_cout(&local_240,
                 (comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
  __os = std::operator<<(&local_240,(char (*) [7])"[Rank ");
  local_244 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
  __os_00 = std::operator<<(__os,&local_244);
  __os_01 = std::operator<<(__os_00,(char (*) [10])"]: Found ");
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_f8);
  __os_02 = std::operator<<(__os_01,(unsigned_long *)
                                    &all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
  __os_03 = std::operator<<(__os_02,(char (*) [19])" unique elements: ");
  this_00 = std::operator<<(__os_03,(vector<int,_std::allocator<int>_> *)local_f8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  mxx::sync_basic_ostream<char,_std::char_traits<char>_>::~sync_basic_ostream(&local_240);
  mxx::comm::comm((comm *)&gtest_ar.message_);
  mxx::allgatherv<int>
            ((vector<int,_std::allocator<int>_> *)local_268,
             (vector<int,_std::allocator<int>_> *)local_f8,(comm *)&gtest_ar.message_);
  mxx::comm::~comm((comm *)&gtest_ar.message_);
  local_2a0 = 10;
  local_2a8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_268);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_298,"10ul","all.size()",&local_2a0,&local_2a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar2) {
    testing::Message::Message(&local_2b0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x84,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  if (bVar2) {
    for (gtest_ar_1.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar1.ptr_ = gtest_ar_1.message_.ptr_,
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)local_268), sVar1.ptr_ < pbVar8;
        gtest_ar_1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_1.message_.ptr_)->field_0x1) {
      local_2dc = (int)gtest_ar_1.message_.ptr_;
      actual = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_268,
                          (size_type)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_2d8,"(int)i","all[i]",&local_2dc,actual);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar2) {
        testing::Message::Message(&local_2e8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                   ,0x86,pcVar7);
        testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        testing::Message::~Message(&local_2e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      if (!bVar2) break;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_268);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  mxx::comm::~comm((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxSort, Unique) {
    mxx::comm c;
    std::vector<int> vec(100);
    std::srand(13*c.rank());
    int i = 0;
    std::generate(vec.begin(), vec.end(), [&i](){return i++ % 10;});
    mxx::sort(vec.begin(), vec.end());
    std::vector<int>::iterator newend = mxx::unique(vec.begin(), vec.end());
    std::vector<int> unique_els(vec.begin(), newend);

    mxx::sync_cout(c) << "[Rank " << c.rank() << "]: Found " << unique_els.size() << " unique elements: " << unique_els << std::endl;

    std::vector<int> all = mxx::allgatherv(unique_els);
    ASSERT_EQ(10ul, all.size());
    for (size_t i = 0; i < all.size(); ++i) {
        ASSERT_EQ((int)i, all[i]);
    }
}